

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::BeginCustomSection(BinaryWriter *this,char *name)

{
  Stream *this_00;
  PrintChars in_R9D;
  string_view s;
  string_view local_98;
  char local_88 [8];
  char desc [100];
  char *name_local;
  BinaryWriter *this_local;
  
  snprintf(local_88,100,"section \"%s\"",name);
  WriteSectionHeader(this,local_88,Custom);
  this_00 = this->stream_;
  string_view::string_view(&local_98,name);
  s.size_ = (size_type)"custom section name";
  s.data_ = (char *)local_98.size_;
  WriteStr((wabt *)this_00,(Stream *)local_98.data_,s,&DAT_00000001,in_R9D);
  return;
}

Assistant:

void BinaryWriter::BeginCustomSection(const char* name) {
  char desc[100];
  wabt_snprintf(desc, sizeof(desc), "section \"%s\"", name);
  WriteSectionHeader(desc, BinarySection::Custom);
  WriteStr(stream_, name, "custom section name", PrintChars::Yes);
}